

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O0

bool __thiscall wallet::WalletBatch::WriteTx(WalletBatch *this,CWalletTx *wtx)

{
  byte bVar1;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  CWalletTx *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  undefined1 fOverwrite;
  CWalletTx *value;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  WalletBatch *in_stack_ffffffffffffffa0;
  pointer local_8;
  
  fOverwrite = (undefined1)((ulong)in_RDI >> 0x38);
  local_8 = *(pointer *)(in_FS_OFFSET + 0x28);
  CWalletTx::GetHash(in_stack_ffffffffffffff78);
  value = (CWalletTx *)&stack0xffffffffffffffb8;
  std::make_pair<std::__cxx11::string_const&,transaction_identifier<false>const&>
            (in_stack_ffffffffffffff80,(transaction_identifier<false> *)in_stack_ffffffffffffff78);
  bVar1 = WriteIC<std::pair<std::__cxx11::string,transaction_identifier<false>>,wallet::CWalletTx>
                    (in_stack_ffffffffffffffa0,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_transaction_identifier<false>_>
                      *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),value,
                     (bool)fOverwrite);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_transaction_identifier<false>_>
  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_transaction_identifier<false>_>
           *)in_stack_ffffffffffffff78);
  if (*(pointer *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)(bVar1 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool WalletBatch::WriteTx(const CWalletTx& wtx)
{
    return WriteIC(std::make_pair(DBKeys::TX, wtx.GetHash()), wtx);
}